

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O1

int archive_format_gnutar_header(archive_write *a,char *h,archive_entry *entry,int tartype)

{
  void *pvVar1;
  mode_t mVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  la_int64_t lVar9;
  ulong uVar10;
  dev_t dVar11;
  char *pcVar12;
  uint uVar13;
  dev_t dVar14;
  long lVar15;
  uint uVar16;
  
  pvVar1 = a->format_data;
  memcpy(h,"",0x200);
  uVar16 = tartype - 0x4b;
  if (uVar16 < 2) {
    pcVar5 = archive_entry_pathname(entry);
    uVar6 = strlen(pcVar5);
  }
  else {
    pcVar5 = *(char **)((long)pvVar1 + 0x20);
    uVar6 = *(ulong *)((long)pvVar1 + 0x28);
  }
  if (99 < uVar6) {
    uVar6 = 100;
  }
  memcpy(h,pcVar5,uVar6);
  uVar6 = *(ulong *)((long)pvVar1 + 0x18);
  if (uVar6 != 0) {
    sVar7 = 100;
    if (uVar6 < 100) {
      sVar7 = uVar6;
    }
    memcpy(h + 0x9d,*(void **)((long)pvVar1 + 0x10),sVar7);
  }
  if (uVar16 < 2) {
    pcVar5 = archive_entry_uname(entry);
    uVar6 = strlen(pcVar5);
  }
  else {
    pcVar5 = *(char **)((long)pvVar1 + 0x30);
    uVar6 = *(ulong *)((long)pvVar1 + 0x38);
  }
  if (uVar6 != 0) {
    sVar7 = 0x20;
    if (uVar6 < 0x20) {
      sVar7 = uVar6;
    }
    memcpy(h + 0x109,pcVar5,sVar7);
  }
  if (uVar16 < 2) {
    pcVar5 = archive_entry_gname(entry);
    sVar7 = strlen(pcVar5);
  }
  else {
    pcVar5 = *(char **)((long)pvVar1 + 0x40);
    sVar7 = *(size_t *)((long)pvVar1 + 0x48);
  }
  if (sVar7 != 0) {
    sVar8 = strlen(pcVar5);
    if (0x20 < sVar8) {
      sVar7 = 0x20;
    }
    memcpy(h + 0x129,pcVar5,sVar7);
  }
  mVar2 = archive_entry_mode(entry);
  uVar16 = 8;
  uVar6 = (ulong)(mVar2 & 0xfff);
  pcVar5 = h + 0x6b;
  do {
    pcVar12 = pcVar5;
    uVar10 = uVar6;
    pcVar12[-1] = (byte)uVar10 & 7 | 0x30;
    uVar16 = uVar16 - 1;
    uVar6 = uVar10 >> 3;
    pcVar5 = pcVar12 + -1;
  } while (1 < uVar16);
  if (7 < uVar10) {
    builtin_strncpy(pcVar12 + -1,"7777777",7);
  }
  lVar9 = archive_entry_uid(entry);
  iVar3 = format_number(lVar9,h + 0x6c,7,8);
  if (iVar3 == 0) {
    iVar3 = 0;
  }
  else {
    lVar9 = archive_entry_uid(entry);
    archive_set_error(&a->archive,0x22,"Numeric user ID %jd too large",lVar9);
    iVar3 = -0x19;
  }
  lVar9 = archive_entry_gid(entry);
  iVar4 = format_number(lVar9,h + 0x74,7,8);
  if (iVar4 != 0) {
    lVar9 = archive_entry_gid(entry);
    archive_set_error(&a->archive,0x22,"Numeric group ID %jd too large",lVar9);
    iVar3 = -0x19;
  }
  lVar9 = archive_entry_size(entry);
  uVar16 = 0xc;
  iVar4 = format_number(lVar9,h + 0x7c,0xb,0xc);
  if (iVar4 != 0) {
    archive_set_error(&a->archive,0x22,"File size out of range");
    iVar3 = -0x19;
  }
  uVar10 = archive_entry_mtime(entry);
  uVar6 = 0;
  if (0 < (long)uVar10) {
    uVar6 = uVar10;
  }
  pcVar5 = h + 0x93;
  do {
    uVar10 = uVar6;
    pcVar12 = pcVar5;
    pcVar12[-1] = (byte)uVar10 & 7 | 0x30;
    uVar16 = uVar16 - 1;
    pcVar5 = pcVar12 + -1;
    uVar6 = uVar10 >> 3;
  } while (1 < uVar16);
  if (7 < uVar10) {
    builtin_strncpy(pcVar12 + -1,"77777777777",0xb);
  }
  mVar2 = archive_entry_filetype(entry);
  if (mVar2 != 0x6000) {
    mVar2 = archive_entry_filetype(entry);
    if (mVar2 != 0x2000) goto LAB_0016d68a;
  }
  dVar11 = archive_entry_rdevmajor(entry);
  dVar14 = 0;
  if (0 < (long)dVar11) {
    dVar14 = dVar11;
  }
  uVar16 = 7;
  pcVar5 = h + 0x14f;
  do {
    uVar6 = dVar14;
    pcVar12 = pcVar5;
    pcVar12[-1] = (byte)uVar6 & 7 | 0x30;
    uVar16 = uVar16 - 1;
    pcVar5 = pcVar12 + -1;
    dVar14 = uVar6 >> 3;
  } while (1 < uVar16);
  if (7 < uVar6) {
    builtin_strncpy(pcVar12 + -1,"777777",6);
    archive_set_error(&a->archive,0x22,"Major device number too large");
    iVar3 = -0x19;
  }
  dVar11 = archive_entry_rdevminor(entry);
  dVar14 = 0;
  if (0 < (long)dVar11) {
    dVar14 = dVar11;
  }
  uVar16 = 7;
  pcVar5 = h + 0x157;
  do {
    uVar6 = dVar14;
    pcVar12 = pcVar5;
    pcVar12[-1] = (byte)uVar6 & 7 | 0x30;
    uVar16 = uVar16 - 1;
    pcVar5 = pcVar12 + -1;
    dVar14 = uVar6 >> 3;
  } while (1 < uVar16);
  if (7 < uVar6) {
    builtin_strncpy(pcVar12 + -1,"777777",6);
    archive_set_error(&a->archive,0x22,"Minor device number too large");
    iVar3 = -0x19;
  }
LAB_0016d68a:
  h[0x9c] = (char)tartype;
  lVar15 = 0;
  uVar16 = 0;
  do {
    uVar16 = uVar16 + (byte)h[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x200);
  h[0x9a] = '\0';
  uVar13 = 7;
  uVar6 = (ulong)uVar16;
  pcVar5 = h + 0x9a;
  do {
    pcVar12 = pcVar5;
    uVar10 = uVar6;
    pcVar12[-1] = (byte)uVar10 & 7 | 0x30;
    uVar13 = uVar13 - 1;
    uVar6 = uVar10 >> 3;
    pcVar5 = pcVar12 + -1;
  } while (1 < uVar13);
  if (7 < uVar10) {
    builtin_strncpy(pcVar12 + -1,"777777",6);
  }
  return iVar3;
}

Assistant:

static int
archive_format_gnutar_header(struct archive_write *a, char h[512],
    struct archive_entry *entry, int tartype)
{
	unsigned int checksum;
	int i, ret;
	size_t copy_length;
	const char *p;
	struct gnutar *gnutar;

	gnutar = (struct gnutar *)a->format_data;

	ret = 0;

	/*
	 * The "template header" already includes the signature,
	 * various end-of-field markers, and other required elements.
	 */
	memcpy(h, &template_header, 512);

	/*
	 * Because the block is already null-filled, and strings
	 * are allowed to exactly fill their destination (without null),
	 * I use memcpy(dest, src, strlen()) here a lot to copy strings.
	 */

	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_pathname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->pathname;
		copy_length = gnutar->pathname_length;
	}
	if (copy_length > GNUTAR_name_size)
		copy_length = GNUTAR_name_size;
	memcpy(h + GNUTAR_name_offset, p, copy_length);

	if ((copy_length = gnutar->linkname_length) > 0) {
		if (copy_length > GNUTAR_linkname_size)
			copy_length = GNUTAR_linkname_size;
		memcpy(h + GNUTAR_linkname_offset, gnutar->linkname,
		    copy_length);
	}

	/* TODO: How does GNU tar handle unames longer than GNUTAR_uname_size? */
	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_uname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->uname;
		copy_length = gnutar->uname_length;
	}
	if (copy_length > 0) {
		if (copy_length > GNUTAR_uname_size)
			copy_length = GNUTAR_uname_size;
		memcpy(h + GNUTAR_uname_offset, p, copy_length);
	}

	/* TODO: How does GNU tar handle gnames longer than GNUTAR_gname_size? */
	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_gname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->gname;
		copy_length = gnutar->gname_length;
	}
	if (copy_length > 0) {
		if (strlen(p) > GNUTAR_gname_size)
			copy_length = GNUTAR_gname_size;
		memcpy(h + GNUTAR_gname_offset, p, copy_length);
	}

	/* By truncating the mode here, we ensure it always fits. */
	format_octal(archive_entry_mode(entry) & 07777,
	    h + GNUTAR_mode_offset, GNUTAR_mode_size);

	/* GNU tar supports base-256 here, so should never overflow. */
	if (format_number(archive_entry_uid(entry), h + GNUTAR_uid_offset,
		GNUTAR_uid_size, GNUTAR_uid_max_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric user ID %jd too large",
		    (intmax_t)archive_entry_uid(entry));
		ret = ARCHIVE_FAILED;
	}

	/* GNU tar supports base-256 here, so should never overflow. */
	if (format_number(archive_entry_gid(entry), h + GNUTAR_gid_offset,
		GNUTAR_gid_size, GNUTAR_gid_max_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric group ID %jd too large",
		    (intmax_t)archive_entry_gid(entry));
		ret = ARCHIVE_FAILED;
	}

	/* GNU tar supports base-256 here, so should never overflow. */
	if (format_number(archive_entry_size(entry), h + GNUTAR_size_offset,
		GNUTAR_size_size, GNUTAR_size_max_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File size out of range");
		ret = ARCHIVE_FAILED;
	}

	/* Shouldn't overflow before 2106, since mtime field is 33 bits. */
	format_octal(archive_entry_mtime(entry),
	    h + GNUTAR_mtime_offset, GNUTAR_mtime_size);

	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR) {
		if (format_octal(archive_entry_rdevmajor(entry),
		    h + GNUTAR_rdevmajor_offset,
			GNUTAR_rdevmajor_size)) {
			archive_set_error(&a->archive, ERANGE,
			    "Major device number too large");
			ret = ARCHIVE_FAILED;
		}

		if (format_octal(archive_entry_rdevminor(entry),
		    h + GNUTAR_rdevminor_offset,
			GNUTAR_rdevminor_size)) {
			archive_set_error(&a->archive, ERANGE,
			    "Minor device number too large");
			ret = ARCHIVE_FAILED;
		}
	}

	h[GNUTAR_typeflag_offset] = tartype;

	checksum = 0;
	for (i = 0; i < 512; i++)
		checksum += 255 & (unsigned int)h[i];
	h[GNUTAR_checksum_offset + 6] = '\0'; /* Can't be pre-set in the template. */
	/* h[GNUTAR_checksum_offset + 7] = ' '; */ /* This is pre-set in the template. */
	format_octal(checksum, h + GNUTAR_checksum_offset, 6);
	return (ret);
}